

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

offset_t __thiscall
ser::OffsetTable::GetOffset(OffsetTable *this,Savepoint *savepoint,string *fieldName)

{
  const_iterator cVar1;
  offset_t oVar2;
  ostream *poVar3;
  SerializationException *this_00;
  SerializationException exception;
  ostringstream msg;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  undefined1 local_1c8 [24];
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  ostringstream local_190 [376];
  
  cVar1 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    oVar2 = GetOffset(this,*(int *)&cVar1._M_node[3]._M_left,fieldName);
    return oVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error: savepoint ",0x11);
  Savepoint::ToString_abi_cxx11_((string *)local_1d8,savepoint);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1d8,(long)local_1d0._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not registered in table\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Retrieving the offset of the field ",0x23);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(fieldName->_M_dataplus)._M_p,fieldName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not possible\n",0x11);
  if (local_1d8 != (undefined1  [8])local_1c8) {
    operator_delete((void *)local_1d8);
  }
  local_1d0._M_p = local_1c8 + 8;
  local_1d8 = (undefined1  [8])&PTR__SerializationException_0013c730;
  local_1c8._0_8_ = 0;
  local_1c8[8] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1d0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_1d8);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

OffsetTable::offset_t OffsetTable::GetOffset(const Savepoint& savepoint, const std::string& fieldName) const
{
    // Find savepoint ID
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    if (iter == savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is not registered in table\n"
            << "Retrieving the offset of the field " << fieldName <<  " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    return GetOffset(iter->second, fieldName);
}